

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O2

bool deqp::egl::anon_unknown_3::checkVersionString
               (TestLog *log,Functions *gl,bool desktop,int major,int minor)

{
  ostringstream *this;
  byte bVar1;
  bool bVar2;
  GLenum GVar3;
  GLubyte *pGVar4;
  byte *pbVar5;
  long lVar6;
  int iVar7;
  undefined7 in_register_00000011;
  int iVar8;
  char *pcVar9;
  deInt32 profile;
  GLint local_1b4;
  undefined1 local_1b0 [384];
  
  pGVar4 = (*gl->getString)(0x1f02);
  local_1b0._0_8_ = log;
  if ((int)CONCAT71(in_register_00000011,desktop) == 0) {
    pcVar9 = "OpenGL ES ";
    if (major == 1) {
      pcVar9 = "OpenGL ES-CM ";
    }
    for (lVar6 = 0; pcVar9[lVar6] != '\0'; lVar6 = lVar6 + 1) {
      if (pcVar9[lVar6] != pGVar4[lVar6]) {
        this = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this);
        std::operator<<((ostream *)this,"Invalid version string prefix. Expected \'");
        std::operator<<((ostream *)this,pcVar9);
        std::operator<<((ostream *)this,"\'.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00dd7008;
      }
    }
    pGVar4 = pGVar4 + lVar6;
  }
  iVar7 = 0;
  for (pbVar5 = pGVar4 + 2; bVar1 = pbVar5[-2], bVar1 != 0; pbVar5 = pbVar5 + 1) {
    if (bVar1 == 0x2e) {
      iVar8 = 0;
      goto LAB_00dd6cf8;
    }
    if ((byte)(bVar1 - 0x3a) < 0xf6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),
                      "Failed to parse major version number. Not a number.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00dd7008;
    }
    if (iVar7 == 0 && (char)bVar1 + -0x30 == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),
                      "Failed to parse major version number. Begins with zero.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00dd7008;
    }
    iVar7 = (char)bVar1 + -0x30 + iVar7 * 10;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  std::operator<<((ostream *)(local_1b0 + 8),
                  "Failed to parse version. Expected \'.\' after major version number.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00dd7008:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  return false;
LAB_00dd6cf8:
  bVar1 = pbVar5[-1];
  if (((ulong)bVar1 < 0x2f) && ((0x400100000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
    if (!desktop) {
      if (iVar7 < major) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::operator<<((ostream *)(local_1b0 + 8),"Major version is less than required.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        if (iVar7 != major) {
          return true;
        }
        if (minor <= iVar8) {
          return true;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::operator<<((ostream *)(local_1b0 + 8),"Minor version is less than required.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      goto LAB_00dd7008;
    }
    if (iVar7 < major) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),"Major version is less than required.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00dd7008;
    }
    if ((iVar7 == major) && (iVar8 < minor)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),"Minor version is less than required.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00dd7008;
    }
    bVar2 = true;
    if ((iVar7 == major) && (iVar8 == minor)) {
      return true;
    }
    if ((major < 3) || ((major ^ 3U) == 0 && minor == 0)) {
      if ((iVar7 == 3) && (iVar8 == 1)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b0,"GL_ARB_compatibility",(allocator<char> *)&local_1b4);
        bVar2 = glu::hasExtension(gl,(ApiType)0x113,(string *)local_1b0);
        std::__cxx11::string::~string((string *)local_1b0);
        if (bVar2) {
          return true;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::operator<<((ostream *)(local_1b0 + 8),
                        "Required OpenGL 3.0 or earlier. Got OpenGL 3.1 without GL_ARB_compatibility."
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00dd7008;
      }
      if ((iVar7 < 4) && (iVar7 != 3 || iVar8 < minor)) {
        return false;
      }
      local_1b4 = 0;
      (*gl->getIntegerv)(0x9126,&local_1b4);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glGetIntegerv()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                      ,0x23a);
      bVar2 = local_1b4 == 2;
      if (bVar2) {
        return bVar2;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),
                      "Required OpenGL 3.0 or earlier. Got later version without compatibility profile."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else if ((major ^ 3U) == 0 && minor == 1) {
      if (iVar7 < 4) {
        if (iVar7 != 3) {
          return false;
        }
        if (iVar8 < 1) {
          return false;
        }
      }
      local_1b4 = 0;
      (*gl->getIntegerv)(0x9126,&local_1b4);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glGetIntegerv()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                      ,0x250);
      bVar2 = local_1b4 == 1;
      if (bVar2) {
        return bVar2;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),
                      "Required OpenGL 3.1. Got later version without core profile.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),"Couldn\'t do any further compatibilyt checks.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    return bVar2;
  }
  if ((byte)(bVar1 - 0x3a) < 0xf6) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"Failed to parse minor version number. Not a number."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_00dd7008;
  }
  if ((iVar8 == 0 && (char)bVar1 + -0x30 == 0) &&
     ((0x2e < (ulong)*pbVar5 || ((0x400100000001U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0))))
  goto LAB_00dd6fd7;
  iVar8 = (char)bVar1 + -0x30 + iVar8 * 10;
  pbVar5 = pbVar5 + 1;
  goto LAB_00dd6cf8;
LAB_00dd6fd7:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  std::operator<<((ostream *)(local_1b0 + 8),"Failed to parse minor version number. Leading zeros.")
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  goto LAB_00dd7008;
}

Assistant:

bool checkVersionString (TestLog& log, const glw::Functions& gl, bool desktop, int major, int minor)
{
	const char* const	versionStr	= (const char*)gl.getString(GL_VERSION);
	const char*			iter		= versionStr;

	int majorVersion = 0;
	int minorVersion = 0;

	// Check embedded version prefixes
	if (!desktop)
	{
		const char* prefix		= NULL;
		const char* prefixIter	= NULL;

		if (major == 1)
			prefix = "OpenGL ES-CM ";
		else
			prefix = "OpenGL ES ";

		prefixIter = prefix;

		while (*prefixIter)
		{
			if ((*prefixIter) != (*iter))
			{
				log << TestLog::Message << "Invalid version string prefix. Expected '" << prefix << "'." << TestLog::EndMessage;
				return false;
			}

			prefixIter++;
			iter++;
		}
	}

	while ((*iter) && (*iter) != '.')
	{
		const int val = (*iter) - '0';

		// Not a number
		if (val < 0 || val > 9)
		{
			log << TestLog::Message << "Failed to parse major version number. Not a number." << TestLog::EndMessage;
			return false;
		}

		// Leading zero
		if (majorVersion == 0 && val == 0)
		{
			log << TestLog::Message << "Failed to parse major version number. Begins with zero." << TestLog::EndMessage;
			return false;
		}

		majorVersion = majorVersion * 10 + val;

		iter++;
	}

	// Invalid format
	if ((*iter) != '.')
	{
		log << TestLog::Message << "Failed to parse version. Expected '.' after major version number." << TestLog::EndMessage;
		return false;
	}

	iter++;

	while ((*iter) && (*iter) != ' ' && (*iter) != '.')
	{
		const int val = (*iter) - '0';

		// Not a number
		if (val < 0 || val > 9)
		{
			log << TestLog::Message << "Failed to parse minor version number. Not a number." << TestLog::EndMessage;
			return false;
		}

		// Leading zero
		if (minorVersion == 0 && val == 0)
		{
			// Leading zeros in minor version
			if ((*(iter + 1)) != ' ' && (*(iter + 1)) != '.' && (*(iter + 1)) != '\0')
			{
				log << TestLog::Message << "Failed to parse minor version number. Leading zeros." << TestLog::EndMessage;
				return false;
			}
		}

		minorVersion = minorVersion * 10 + val;

		iter++;
	}

	// Invalid format
	if ((*iter) != ' ' && (*iter) != '.' && (*iter) != '\0')
		return false;

	if (desktop)
	{
		if (majorVersion < major)
		{
			log << TestLog::Message << "Major version is less than required." << TestLog::EndMessage;
			return false;
		}
		else if (majorVersion == major && minorVersion < minor)
		{
			log << TestLog::Message << "Minor version is less than required." << TestLog::EndMessage;
			return false;
		}
		else if (majorVersion == major && minorVersion == minor)
			return true;

		if (major < 3 || (major == 3 && minor == 0))
		{
			if (majorVersion == 3 && minorVersion == 1)
			{
				if (glu::hasExtension(gl, glu::ApiType::core(3, 1), "GL_ARB_compatibility"))
					return true;
				else
				{
					log << TestLog::Message << "Required OpenGL 3.0 or earlier. Got OpenGL 3.1 without GL_ARB_compatibility." << TestLog::EndMessage;
					return false;
				}
			}
			else if (majorVersion > 3 || (majorVersion == 3 && minorVersion >= minor))
			{
				deInt32 profile = 0;

				gl.getIntegerv(GL_CONTEXT_PROFILE_MASK, &profile);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

				if (profile == GL_CONTEXT_COMPATIBILITY_PROFILE_BIT)
					return true;
				else
				{
					log << TestLog::Message << "Required OpenGL 3.0 or earlier. Got later version without compatibility profile." << TestLog::EndMessage;
					return false;
				}
			}
			else
				DE_ASSERT(false);

			return false;
		}
		else if (major == 3 && minor == 1)
		{
			if (majorVersion > 3 || (majorVersion == 3 && minorVersion >= minor))
			{
				deInt32 profile = 0;

				gl.getIntegerv(GL_CONTEXT_PROFILE_MASK, &profile);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

				if (profile == GL_CONTEXT_CORE_PROFILE_BIT)
					return true;
				else
				{
					log << TestLog::Message << "Required OpenGL 3.1. Got later version without core profile." << TestLog::EndMessage;
					return false;
				}
			}
			else
				DE_ASSERT(false);

			return false;
		}
		else
		{
			log << TestLog::Message << "Couldn't do any further compatibilyt checks." << TestLog::EndMessage;
			return true;
		}
	}
	else
	{
		if (majorVersion < major)
		{
			log << TestLog::Message << "Major version is less than required." << TestLog::EndMessage;
			return false;
		}
		else if (majorVersion == major && minorVersion < minor)
		{
			log << TestLog::Message << "Minor version is less than required." << TestLog::EndMessage;
			return false;
		}
		else
			return true;
	}
}